

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

void opj_jp2_setup_decoder(opj_jp2_t *jp2,opj_dparameters_t *parameters)

{
  opj_j2k_setup_decoder(jp2->j2k,parameters);
  (jp2->color).jp2_has_colr = '\0';
  jp2->ignore_pclr_cmap_cdef = parameters->flags & 1;
  return;
}

Assistant:

void opj_jp2_setup_decoder(opj_jp2_t *jp2, opj_dparameters_t *parameters)
{
    /* setup the J2K codec */
    opj_j2k_setup_decoder(jp2->j2k, parameters);

    /* further JP2 initializations go here */
    jp2->color.jp2_has_colr = 0;
    jp2->ignore_pclr_cmap_cdef = parameters->flags &
                                 OPJ_DPARAMETERS_IGNORE_PCLR_CMAP_CDEF_FLAG;
}